

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereBoxCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSphereBoxCollisionAlgorithm::processCollision
          (btSphereBoxCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  bool bVar1;
  int iVar2;
  btTransform *this_00;
  btVector3 *pbVar3;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  long in_RDI;
  btManifoldResult *in_R8;
  btScalar maxContactDistance;
  btScalar radius;
  btSphereShape *sphere0;
  btVector3 sphereCenter;
  btScalar penetrationDepth;
  btVector3 normalOnSurfaceB;
  btVector3 pOnBox;
  btCollisionObjectWrapper *boxObjWrap;
  btCollisionObjectWrapper *sphereObjWrap;
  btCollisionObjectWrapper *local_98;
  btCollisionObjectWrapper *this_01;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  btVector3 local_58;
  btVector3 local_48;
  btCollisionObjectWrapper *local_38;
  btCollisionObjectWrapper *local_30;
  btManifoldResult *local_28;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    this_01 = in_RSI;
    if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
      this_01 = in_RDX;
    }
    local_98 = in_RDX;
    if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
      local_98 = in_RSI;
    }
    local_38 = local_98;
    local_30 = this_01;
    local_28 = in_R8;
    btVector3::btVector3(&local_48);
    btVector3::btVector3(&local_58);
    this_00 = btCollisionObjectWrapper::getWorldTransform(local_30);
    pbVar3 = btTransform::getOrigin(this_00);
    uVar4 = (undefined4)((ulong)*(undefined8 *)(pbVar3->m_floats + 2) >> 0x20);
    btCollisionObjectWrapper::getCollisionShape(local_30);
    btSphereShape::getRadius((btSphereShape *)this_01);
    btPersistentManifold::getContactBreakingThreshold(*(btPersistentManifold **)(in_RDI + 0x18));
    btManifoldResult::setPersistentManifold(local_28,*(btPersistentManifold **)(in_RDI + 0x18));
    bVar1 = getSphereDistance((btSphereBoxCollisionAlgorithm *)body0Wrap,body1Wrap,
                              (btVector3 *)dispatchInfo,(btVector3 *)resultOut,
                              (btScalar *)sphereObjWrap,(btVector3 *)boxObjWrap,pOnBox.m_floats[3],
                              pOnBox.m_floats[2]);
    if (bVar1) {
      (*(local_28->super_Result)._vptr_Result[4])
                (in_stack_ffffffffffffffa4,local_28,&local_58,&local_48);
    }
    if (((*(byte *)(in_RDI + 0x10) & 1) != 0) &&
       (iVar2 = btPersistentManifold::getNumContacts(*(btPersistentManifold **)(in_RDI + 0x18)),
       iVar2 != 0)) {
      btManifoldResult::refreshContactPoints
                ((btManifoldResult *)CONCAT44(in_stack_ffffffffffffffa4,uVar4));
    }
  }
  return;
}

Assistant:

void btSphereBoxCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap, const btCollisionObjectWrapper* body1Wrap, const btDispatcherInfo& dispatchInfo, btManifoldResult* resultOut)
{
	(void)dispatchInfo;
	(void)resultOut;
	if (!m_manifoldPtr)
		return;

	const btCollisionObjectWrapper* sphereObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* boxObjWrap = m_isSwapped? body0Wrap : body1Wrap;

	btVector3 pOnBox;

	btVector3 normalOnSurfaceB;
	btScalar penetrationDepth;
	btVector3 sphereCenter = sphereObjWrap->getWorldTransform().getOrigin();
	const btSphereShape* sphere0 = (const btSphereShape*)sphereObjWrap->getCollisionShape();
	btScalar radius = sphere0->getRadius();
	btScalar maxContactDistance = m_manifoldPtr->getContactBreakingThreshold();

	resultOut->setPersistentManifold(m_manifoldPtr);

	if (getSphereDistance(boxObjWrap, pOnBox, normalOnSurfaceB, penetrationDepth, sphereCenter, radius, maxContactDistance))
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		resultOut->addContactPoint(normalOnSurfaceB, pOnBox, penetrationDepth);
	}

	if (m_ownManifold)
	{
		if (m_manifoldPtr->getNumContacts())
		{
			resultOut->refreshContactPoints();
		}
	}

}